

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result.hpp
# Opt level: O2

error_type * __thiscall
toml::result<toml::detail::none_t,_toml::error_info>::unwrap_err
          (result<toml::detail::none_t,_toml::error_info> *this,source_location loc)

{
  undefined1 auVar1 [16];
  source_location loc_local;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (this->is_ok_ != true) {
    return (error_type *)&this->field_1;
  }
  loc_local = loc;
  auVar1 = __cxa_allocate_exception(0x28);
  cxx::to_string_abi_cxx11_(&local_58,(cxx *)&loc_local,auVar1._8_8_);
  std::operator+(&local_38,"toml::result: bad unwrap_err",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_58);
  bad_result_access::bad_result_access(auVar1._0_8_,(string *)&local_38);
  __cxa_throw(auVar1._0_8_,&bad_result_access::typeinfo,bad_result_access::~bad_result_access);
}

Assistant:

error_type const& unwrap_err(cxx::source_location loc = cxx::source_location::current()) const
    {
        if(this->is_ok())
        {
            throw bad_result_access("toml::result: bad unwrap_err" + cxx::to_string(loc));
        }
        return this->fail_.get();
    }